

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::GetCurrentFunction(JavascriptStackWalker *this,bool includeInlinedFrames)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  void **ppvVar5;
  
  if (((*(ushort *)&this->field_0x50 >> 2 | *(ushort *)&this->field_0x50) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x40b,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((includeInlinedFrames) && ((this->field_0x50 & 1) != 0)) {
    pJVar4 = InlinedFrameWalker::GetFunctionObject(&this->inlinedFrameWalker);
    return pJVar4;
  }
  if ((this->field_0x50 & 8) == 0) {
    ppvVar5 = GetCurrentArgv(this);
    pJVar4 = StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)*ppvVar5);
    return pJVar4;
  }
  pJVar4 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>
                     (this->prevNativeLibraryEntry->function);
  return pJVar4;
}

Assistant:

JavascriptFunction * JavascriptStackWalker::GetCurrentFunction(bool includeInlinedFrames /* = true */) const
    {
        Assert(this->IsJavascriptFrame());

#if ENABLE_NATIVE_CODEGEN
        if (includeInlinedFrames && inlinedFramesBeingWalked)
        {
            return inlinedFrameWalker.GetFunctionObject();
        }
        else
#endif
            if (this->isNativeLibraryFrame)
        {
            // Return saved function. Do not read from stack as compiler may stackpack/optimize args.
            return VarTo<JavascriptFunction>(this->prevNativeLibraryEntry->function);
        }
        else
        {
            return StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)this->GetCurrentArgv()[JavascriptFunctionArgIndex_Function]);
        }
    }